

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinSerializer<std::unique_ptr<Person,_std::default_delete<Person>_>,_void>::
     serialize<OutputStream>
               (unique_ptr<Person,_std::default_delete<Person>_> *opt,OutputStream *ostream)

{
  if ((opt->_M_t).super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
      super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
      super__Head_base<0UL,_Person_*,_false>._M_head_impl != (Person *)0x0) {
    TrivialSerializer<unsigned_char>::serialize<OutputStream>('\x01',ostream);
    CustomSerializer<Person,_void>::serialize
              ((opt->_M_t).super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
               super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
               super__Head_base<0UL,_Person_*,_false>._M_head_impl,ostream);
    return;
  }
  TrivialSerializer<unsigned_char>::serialize<OutputStream>('\0',ostream);
  return;
}

Assistant:

static void serialize(const Optional& opt, OutputStream& ostream)
  {
    if (opt)
    {
      mserialize::serialize(std::uint8_t{1}, ostream);
      mserialize::serialize(*opt, ostream);
    }
    else
    {
      mserialize::serialize(std::uint8_t{0}, ostream);
    }
  }